

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
sqlite_orm::internal::
column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>
::default_value_abi_cxx11_
          (column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>
           *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_RDI;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *res;
  
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>(in_RSI);
  iterate_tuple<sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>::default_value[abi:cxx11]()const::_lambda(auto:1&)_1_,sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>
            ((tuple<sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>
              *)in_RSI,
             (anon_class_8_1_ba1d7400 *)
             in_RDI._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )in_RDI._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
}

Assistant:

std::unique_ptr<std::string> default_value() const {
        std::unique_ptr<std::string> res;
        iterate_tuple(this->constraints, [&res](auto &v) {
          auto dft = internal::default_value_extractor()(v);
          if(dft) {
              res = std::move(dft);
          }
        });
        return res;
    }